

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_throw(lua_State *L,int errcode)

{
  undefined4 in_ESI;
  long in_RDI;
  global_State *g;
  undefined4 in_stack_fffffffffffffff0;
  
  *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x31c) =
       *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x31c) & 0xffffffef;
  *(undefined1 *)(in_RDI + 7) = 0;
  err_raise_ext((global_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),0);
  if (*(long *)((ulong)*(uint *)(in_RDI + 8) + 0x178) != 0) {
    (**(code **)((ulong)*(uint *)(in_RDI + 8) + 0x178))(in_RDI);
  }
  exit(1);
}

Assistant:

LJ_FASTCALL lj_err_throw(lua_State *L, int errcode)
{
  global_State *g = G(L);
  lj_trace_abort(g);
  L->status = LUA_OK;
#if LJ_UNWIND_EXT
  err_raise_ext(g, errcode);
  /*
  ** A return from this function signals a corrupt C stack that cannot be
  ** unwound. We have no choice but to call the panic function and exit.
  **
  ** Usually this is caused by a C function without unwind information.
  ** This may happen if you've manually enabled LUAJIT_UNWIND_EXTERNAL
  ** and forgot to recompile *every* non-C++ file with -funwind-tables.
  */
  if (G(L)->panic)
    G(L)->panic(L);
#else
#if LJ_HASJIT
  setmref(g->jit_base, NULL);
#endif
  {
    void *cf = err_unwind(L, NULL, errcode);
    if (cframe_unwind_ff(cf))
      lj_vm_unwind_ff(cframe_raw(cf));
    else
      lj_vm_unwind_c(cframe_raw(cf), errcode);
  }
#endif
  exit(EXIT_FAILURE);
}